

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_subd.cpp
# Opt level: O1

bool __thiscall
ON_ObjRefEvaluationParameter::GetSubDComponentParameter
          (ON_ObjRefEvaluationParameter *this,ON_SubDComponentParameter *cp)

{
  double dVar1;
  TYPE TVar2;
  anon_union_8_3_6bf0bb0e_for_m_p0 aVar3;
  ON_SubDFaceParameter fp_00;
  ON_SubDComponentId OVar4;
  undefined8 active_edge_id;
  bool bVar5;
  ON_SubDFaceParameter *this_00;
  double dVar6;
  double dVar7;
  ON_SubDFaceParameter fp;
  ON_SubDFaceCornerDex cdex;
  ON_SubDComponentId vertex_id;
  ON_SubDComponentId face_id;
  ON_SubDFaceParameter local_60;
  ON_SubDFaceCornerDex local_44;
  ON_SubDComponentParameter local_40;
  ON_SubDComponentId local_28;
  
  cp->m_p1 = ON_SubDComponentParameter::Unset.m_p1;
  aVar3 = ON_SubDComponentParameter::Unset.m_p0;
  cp->m_cid = ON_SubDComponentParameter::Unset.m_cid;
  cp->m_p0 = aVar3;
  if (this->m_t_type != 9) goto LAB_005e0977;
  TVar2 = (this->m_t_ci).m_type;
  if (TVar2 == subd_face) {
    dVar1 = this->m_t[0];
    dVar6 = floor(dVar1);
    if ((((dVar1 < 0.0) || (4294967295.0 < dVar1)) || (dVar6 != dVar1)) ||
       (((NAN(dVar6) || NAN(dVar1) || (dVar6 = this->m_t[1], dVar6 < 0.0)) || (4294967295.0 < dVar6)
        ))) goto LAB_005e0977;
    dVar7 = floor(dVar6);
    if ((((dVar6 <= dVar1) || (dVar7 != dVar6)) ||
        ((NAN(dVar7) || NAN(dVar6) ||
         (((this->m_t[2] < 0.0 || (0.5 < this->m_t[2])) || (this->m_t[3] < 0.0)))))) ||
       (0.5 < this->m_t[3])) goto LAB_005e0977;
    ON_SubDComponentId::ON_SubDComponentId(&local_28,Face,(this->m_t_ci).m_index);
    ON_SubDFaceCornerDex::ON_SubDFaceCornerDex
              (&local_44,(uint)(long)this->m_t[0],(uint)(long)this->m_t[1]);
    ON_SubDFaceParameter::ON_SubDFaceParameter(&local_60,local_44,this->m_t[2],this->m_t[3]);
    this_00 = (ON_SubDFaceParameter *)&local_40;
    fp_00.m_s = local_60.m_s;
    fp_00.m_cdex = local_60.m_cdex;
    fp_00._4_4_ = local_60._4_4_;
    fp_00.m_t = local_60.m_t;
    ON_SubDComponentParameter::ON_SubDComponentParameter
              ((ON_SubDComponentParameter *)this_00,local_28,fp_00);
  }
  else if (TVar2 == subd_edge) {
    dVar1 = this->m_t[0];
    dVar6 = floor(dVar1);
    if (((dVar1 < 0.0) || (4294967295.0 < dVar1)) ||
       ((((dVar6 != dVar1 || ((NAN(dVar6) || NAN(dVar1) || (this->m_t[1] < 0.0)))) ||
         (1.0 < this->m_t[1])) ||
        ((((this->m_t[2] != 0.0 || (NAN(this->m_t[2]))) || (this->m_t[3] != 0.0)) ||
         (NAN(this->m_t[3]))))))) goto LAB_005e0977;
    ON_SubDComponentId::ON_SubDComponentId(&local_40.m_cid,Edge,(this->m_t_ci).m_index);
    dVar1 = this->m_t[0];
    dVar6 = this->m_t[1];
    dVar7 = floor(dVar1);
    OVar4 = ON_SubDComponentId::Unset;
    if (((dVar1 < 0.0) || (4294967295.0 < dVar1)) ||
       ((dVar7 != dVar1 || (NAN(dVar7) || NAN(dVar1))))) {
      local_60.m_cdex.m_corner_index = (undefined2)ON_SubDComponentId::Unset.m_id;
      local_60.m_cdex.m_edge_count = ON_SubDComponentId::Unset.m_id._2_2_;
      local_60._4_1_ = ON_SubDComponentId::Unset.m_type_and_dir;
      local_60._5_1_ = ON_SubDComponentId::Unset.m_valueAB[0];
      local_60._6_1_ = ON_SubDComponentId::Unset.m_valueAB[1];
      local_60._7_1_ = ON_SubDComponentId::Unset.m_valueAB[2];
      ON_SubDComponentId::Unset = OVar4;
    }
    else {
      ON_SubDComponentId::ON_SubDComponentId((ON_SubDComponentId *)&local_60,Face,(uint)(long)dVar1)
      ;
    }
    this_00 = &local_60;
    ON_SubDComponentParameter::ON_SubDComponentParameter
              ((ON_SubDComponentParameter *)this_00,local_40.m_cid,dVar6,
               (ON_SubDComponentId)local_60._0_8_);
  }
  else {
    if (TVar2 != subd_vertex) goto LAB_005e0977;
    dVar1 = this->m_t[0];
    dVar6 = floor(dVar1);
    if (((dVar1 < 0.0) || (4294967295.0 < dVar1)) ||
       ((dVar6 != dVar1 || (NAN(dVar6) || NAN(dVar1))))) goto LAB_005e0977;
    dVar1 = this->m_t[1];
    bVar5 = true;
    if ((0.0 <= dVar1) && (dVar1 <= 4294967295.0)) {
      dVar6 = floor(dVar1);
      bVar5 = dVar6 != dVar1;
    }
    if ((((bVar5) || (this->m_t[2] != 0.0)) || (NAN(this->m_t[2]))) ||
       ((this->m_t[3] != 0.0 || (NAN(this->m_t[3]))))) goto LAB_005e0977;
    ON_SubDComponentId::ON_SubDComponentId(&local_40.m_cid,Vertex,(this->m_t_ci).m_index);
    dVar1 = this->m_t[0];
    dVar6 = floor(dVar1);
    OVar4 = ON_SubDComponentId::Unset;
    if (((dVar1 < 0.0) || ((4294967295.0 < dVar1 || (dVar6 != dVar1)))) ||
       (NAN(dVar6) || NAN(dVar1))) {
      local_60.m_cdex.m_corner_index = (undefined2)ON_SubDComponentId::Unset.m_id;
      local_60.m_cdex.m_edge_count = ON_SubDComponentId::Unset.m_id._2_2_;
      local_60._4_1_ = ON_SubDComponentId::Unset.m_type_and_dir;
      local_60._5_1_ = ON_SubDComponentId::Unset.m_valueAB[0];
      local_60._6_1_ = ON_SubDComponentId::Unset.m_valueAB[1];
      local_60._7_1_ = ON_SubDComponentId::Unset.m_valueAB[2];
      ON_SubDComponentId::Unset = OVar4;
    }
    else {
      ON_SubDComponentId::ON_SubDComponentId((ON_SubDComponentId *)&local_60,Edge,(uint)(long)dVar1)
      ;
    }
    active_edge_id = local_60._0_8_;
    dVar1 = this->m_t[1];
    dVar6 = floor(dVar1);
    OVar4 = ON_SubDComponentId::Unset;
    if ((((dVar1 < 0.0) || (4294967295.0 < dVar1)) || (dVar6 != dVar1)) ||
       (NAN(dVar6) || NAN(dVar1))) {
      local_60.m_cdex.m_corner_index = (undefined2)ON_SubDComponentId::Unset.m_id;
      local_60.m_cdex.m_edge_count = ON_SubDComponentId::Unset.m_id._2_2_;
      local_60._4_1_ = ON_SubDComponentId::Unset.m_type_and_dir;
      local_60._5_1_ = ON_SubDComponentId::Unset.m_valueAB[0];
      local_60._6_1_ = ON_SubDComponentId::Unset.m_valueAB[1];
      local_60._7_1_ = ON_SubDComponentId::Unset.m_valueAB[2];
      ON_SubDComponentId::Unset = OVar4;
    }
    else {
      ON_SubDComponentId::ON_SubDComponentId((ON_SubDComponentId *)&local_60,Face,(uint)(long)dVar1)
      ;
    }
    this_00 = &local_60;
    ON_SubDComponentParameter::ON_SubDComponentParameter
              ((ON_SubDComponentParameter *)this_00,local_40.m_cid,
               (ON_SubDComponentId)active_edge_id,(ON_SubDComponentId)local_60._0_8_);
  }
  cp->m_p1 = *(anon_union_8_3_7b68a318_for_m_p1 *)&this_00->m_t;
  aVar3 = *(anon_union_8_3_6bf0bb0e_for_m_p0 *)&this_00->m_s;
  cp->m_cid = *(ON_SubDComponentId *)&this_00->m_cdex;
  cp->m_p0 = aVar3;
LAB_005e0977:
  bVar5 = ON_SubDComponentParameter::IsSet(cp);
  return bVar5;
}

Assistant:

bool ON_ObjRefEvaluationParameter::GetSubDComponentParameter(
  ON_SubDComponentParameter& cp
) const
{
  cp = ON_SubDComponentParameter::Unset;
  if (9 == this->m_t_type)
  {
    switch (this->m_t_ci.m_type)
    {
    case ON_COMPONENT_INDEX::TYPE::subd_vertex:
      if (false == Internal_IsValidUnsigned(this->m_t[0]))
        break;
      if (false == Internal_IsValidUnsigned(this->m_t[1]))
        break;
      if (false == (0.0 == this->m_t[2]))
        break;
      if (false == (0.0 == this->m_t[3]))
        break;
      {
        const ON_SubDComponentId vertex_id(ON_SubDComponentPtr::Type::Vertex, this->m_t_ci.m_index);
        cp = ON_SubDComponentParameter(
          vertex_id, 
          Internal_ComponentIdFromDouble(ON_SubDComponentPtr::Type::Edge, this->m_t[0]),
          Internal_ComponentIdFromDouble(ON_SubDComponentPtr::Type::Face, this->m_t[1]));
      }
      break;
    case ON_COMPONENT_INDEX::TYPE::subd_edge:
      if (false == Internal_IsValidUnsigned(this->m_t[0]))
        break;
      if (false == (0.0 <= this->m_t[1] && this->m_t[1] <= 1.0))
        break;
      if (false == (0.0 == this->m_t[2]))
        break;
      if (false == (0.0 == this->m_t[3]))
        break;
      {
        const ON_SubDComponentId edge_id(ON_SubDComponentPtr::Type::Edge, this->m_t_ci.m_index);
        cp = ON_SubDComponentParameter(
          edge_id,
          this->m_t[1],
          Internal_ComponentIdFromDouble(ON_SubDComponentPtr::Type::Face, this->m_t[0]));
      }
      break;
    case ON_COMPONENT_INDEX::TYPE::subd_face:
      if (false == Internal_IsValidUnsigned(this->m_t[0]))
        break;
      if (false == Internal_IsValidUnsigned(this->m_t[1]))
        break;
      if (false == (this->m_t[0] < this->m_t[1]))
        break;
      if (false == (0.0 <= this->m_t[2] && this->m_t[2] <= 0.5))
        break;
      if (false == (0.0 <= this->m_t[3] && this->m_t[3] <= 0.5))
        break;
      {
        const ON_SubDComponentId face_id(ON_SubDComponentPtr::Type::Face, this->m_t_ci.m_index);
        const ON_SubDFaceCornerDex cdex((unsigned)this->m_t[0], (unsigned)this->m_t[1]);
        ON_SubDFaceParameter fp(cdex, this->m_t[2], this->m_t[3]);
        cp = ON_SubDComponentParameter(face_id, fp);
      }
      break;
    default:
      break;
    }
  }
  return cp.IsSet();
}